

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  TString *pTVar9;
  size_t sVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_0011deb3:
  uVar4 = ls->current;
  switch(uVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
    goto switchD_0011deca_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    goto LAB_0011deb3;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_0011deb3;
  case 0x22:
  case 0x27:
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    goto joined_r0x0011e0c3;
  case 0x2d:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x2d) {
      return 0x2d;
    }
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 == 0x5b) {
      sVar10 = skip_sep(ls);
      ls->buff->n = 0;
      if (sVar10 < 2) {
        uVar4 = ls->current;
        goto LAB_0011dfaa;
      }
      read_long_string(ls,(SemInfo *)0x0,sVar10);
      ls->buff->n = 0;
    }
    else {
LAB_0011dfaa:
      while ((0xe < uVar4 + 1 || ((0x4801U >> (uVar4 + 1 & 0x1f) & 1) == 0))) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      }
    }
    goto LAB_0011deb3;
  case 0x2e:
    save(ls,0x2e);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x2e);
    if (iVar8 != 0) {
      iVar8 = check_next1(ls,0x2e);
      return 0x118 - (uint)(iVar8 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar8 = read_numeral(ls,seminfo);
    return iVar8;
  case 0x2f:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x2f;
    iVar8 = check_next1(ls,0x2f);
    bVar16 = iVar8 == 0;
    iVar8 = 0x116;
    break;
  case 0x3a:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x3a;
    iVar8 = check_next1(ls,0x3a);
    bVar16 = iVar8 == 0;
    iVar8 = 0x11f;
    break;
  case 0x3c:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11b;
    }
    iVar7 = 0x3c;
    iVar8 = check_next1(ls,0x3c);
    bVar16 = iVar8 == 0;
    iVar8 = 0x11d;
    break;
  case 0x3d:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x3d;
    iVar8 = check_next1(ls,0x3d);
    bVar16 = iVar8 == 0;
    iVar8 = 0x119;
    break;
  case 0x3e:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11a;
    }
    iVar7 = 0x3e;
    iVar8 = check_next1(ls,0x3e);
    bVar16 = iVar8 == 0;
    iVar8 = 0x11e;
    break;
  case 0xffffffff:
    return 0x120;
  default:
    if (uVar4 != 0x5b) {
      if (uVar4 == 0x7e) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
        iVar8 = check_next1(ls,0x3d);
        if (iVar8 == 0) {
          return 0x7e;
        }
        return 0x11c;
      }
switchD_0011deca_caseD_0:
      if ((""[(long)(int)uVar4 + 1] & 1) == 0) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        return uVar4;
      }
      do {
        save(ls,uVar4);
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      } while ((""[(long)(int)uVar4 + 1] & 3) != 0);
      pTVar9 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar9;
      if (pTVar9->tt == '\x04') {
        if (pTVar9->extra != 0) {
          return pTVar9->extra + 0xff;
        }
        return 0x123;
      }
      return 0x123;
    }
    sVar10 = skip_sep(ls);
    if (1 < sVar10) {
      read_long_string(ls,seminfo,sVar10);
      return 0x124;
    }
    if (sVar10 != 0) {
      return 0x5b;
    }
    pcVar11 = "invalid long string delimiter";
    goto LAB_0011e7fd;
  }
  if (bVar16) {
    return iVar7;
  }
  return iVar8;
joined_r0x0011e0c3:
  if (uVar5 == uVar4) {
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    pTVar9 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar9;
    return 0x124;
  }
  if ((int)uVar5 < 0x5c) {
    if (uVar5 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x120);
    }
    if ((uVar5 == 10) || (uVar5 == 0xd)) {
      pcVar11 = "unfinished string";
LAB_0011e7fd:
      lexerror(ls,pcVar11,0x124);
    }
LAB_0011e13e:
    save(ls,uVar5);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
  }
  else {
    if (uVar5 != 0x5c) goto LAB_0011e13e;
    save(ls,0x5c);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    if ((int)uVar5 < 0x62) {
      if ((int)uVar5 < 0x22) {
        if (uVar5 == 0xffffffff) goto LAB_0011e3aa;
        if ((uVar5 != 10) && (uVar5 != 0xd)) goto switchD_0011e1a8_caseD_6f;
        inclinenumber(ls);
        uVar12 = 10;
      }
      else {
        uVar12 = uVar5;
        if ((int)uVar5 < 0x5c) {
          if ((uVar5 == 0x22) || (uVar5 == 0x27)) goto LAB_0011e375;
        }
        else if ((uVar5 == 0x5c) || (uVar12 = 7, uVar5 == 0x61)) goto LAB_0011e375;
switchD_0011e1a8_caseD_6f:
        esccheck(ls,""[(long)(int)uVar5 + 1] & 2,"invalid escape sequence");
        uVar12 = 0;
        uVar15 = 0;
        uVar5 = ls->current;
        do {
          if ((""[(long)(int)uVar5 + 1] & 2) == 0) goto LAB_0011e286;
          save(ls,uVar5);
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar6 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar6 = (uint)*pbVar3;
          }
          uVar12 = (uVar5 - 0x30) + uVar12 * 10;
          ls->current = uVar6;
          uVar15 = uVar15 + 1;
          uVar5 = uVar6;
        } while (uVar15 != 3);
        uVar15 = 3;
LAB_0011e286:
        esccheck(ls,(uint)((int)uVar12 < 0x100),"decimal escape too large");
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - (ulong)uVar15;
      }
    }
    else {
      switch(uVar5) {
      case 0x6e:
        uVar12 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
        goto switchD_0011e1a8_caseD_6f;
      case 0x72:
        uVar12 = 0xd;
        break;
      case 0x74:
        uVar12 = 9;
        break;
      case 0x75:
        save(ls,0x75);
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        esccheck(ls,(uint)(uVar5 == 0x7b),"missing \'{\'");
        iVar8 = gethexa(ls);
        uVar13 = (ulong)iVar8;
        lVar14 = -4;
        while( true ) {
          save(ls,ls->current);
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) break;
          esccheck(ls,(uint)(uVar13 < 0x8000000),"UTF-8 value too large");
          iVar8 = luaO_hexavalue(ls->current);
          uVar13 = uVar13 * 0x10 + (long)iVar8;
          lVar14 = lVar14 + -1;
        }
        esccheck(ls,(uint)(uVar5 == 0x7d),"missing \'}\'");
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 + lVar14;
        uVar5 = luaO_utf8esc(local_38,uVar13);
        if (0 < (int)uVar5) {
          pcVar11 = &stack0xffffffffffffffd0 + -(ulong)uVar5;
          uVar13 = (ulong)uVar5 + 1;
          do {
            save(ls,(int)*pcVar11);
            uVar13 = uVar13 - 1;
            pcVar11 = pcVar11 + 1;
          } while (1 < uVar13);
        }
        goto LAB_0011e3aa;
      case 0x76:
        uVar12 = 0xb;
        break;
      case 0x78:
        iVar8 = gethexa(ls);
        iVar7 = gethexa(ls);
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - 2;
        uVar12 = iVar7 + iVar8 * 0x10;
        break;
      case 0x7a:
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - 1;
        do {
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          while( true ) {
            if ((""[(long)(int)uVar5 + 1] & 8) == 0) goto LAB_0011e3aa;
            if ((uVar5 != 0xd) && (uVar5 != 10)) break;
            inclinenumber(ls);
            uVar5 = ls->current;
          }
        } while( true );
      default:
        if (uVar5 == 0x66) {
          uVar12 = 0xc;
        }
        else {
          if (uVar5 != 0x62) goto switchD_0011e1a8_caseD_6f;
          uVar12 = 8;
        }
      }
LAB_0011e375:
      pZVar2 = ls->z;
      sVar10 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar10 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
    }
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    save(ls,uVar12);
  }
LAB_0011e3aa:
  uVar5 = ls->current;
  goto joined_r0x0011e0c3;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          size_t sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 2) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        size_t sep = skip_sep(ls);
        if (sep >= 2) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == 0)  /* '[=...' missing second bracket? */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;  /* '==' */
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;  /* '<=' */
        else if (check_next1(ls, '<')) return TK_SHL;  /* '<<' */
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;  /* '>=' */
        else if (check_next1(ls, '>')) return TK_SHR;  /* '>>' */
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;  /* '//' */
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;  /* '~=' */
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;  /* '::' */
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens ('+', '*', '%', '{', '}', ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}